

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

int __thiscall ON_Xform::IsSimilarity(ON_Xform *this,double tol)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  ON_Interval Spectrum;
  ON_Xform local_88;
  
  bVar5 = 0;
  bVar1 = IsAffine(this);
  iVar2 = 0;
  if (bVar1) {
    pOVar4 = &local_88;
    for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
      pOVar4->m_xform[0][0] = this->m_xform[0][0];
      this = (ON_Xform *)((long)this + ((ulong)bVar5 * -2 + 1) * 8);
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    }
    local_88.m_xform[1][3] = 0.0;
    local_88.m_xform[0][3] = 0.0;
    local_88.m_xform[2][3] = 0.0;
    local_88.m_xform[3][0] = 0.0;
    local_88.m_xform[3][1] = 0.0;
    local_88.m_xform[3][2] = 0.0;
    local_88.m_xform[3][3] = 1.0;
    Spectrum = ApproxSpectrumLTL(&local_88);
    dVar6 = ON_Interval::Mid(&Spectrum);
    dVar7 = ON_Interval::Length(&Spectrum);
    iVar2 = 0;
    if ((dVar7 * 0.5 < tol) && (dVar7 * 0.5 < ABS(dVar6))) {
      dVar6 = Determinant(&local_88,(double *)0x0);
      iVar2 = (uint)(0.0 < dVar6) * 2 + -1;
    }
  }
  return iVar2;
}

Assistant:

int ON_Xform::IsSimilarity(double tol) const
{
	// This function does not construct a similarity transformation,
	// ( see ON_Xform::DecomposeSimilarity() for this ).  It merely
	// indicates that this transformation is sufficiently close to a similarity.
	// However using with a tight tolerance like tol<ON_ZERO_TOLERANCE 
	// Indicates that this is very close to being a similar transformation.
	// This calculations is based on approximations and is only  
	// reliable if tolerance << 1.0. 
	int rval = 0;
	if (IsAffine())
	{
		// L = Linear component of this. 
		// LTL = L^T * L
		//  *this is similar iff Spectrum(LTL) = lambda, for real lambda!=0.0
		ON_Xform L = (*this);
		L.Linearize();


		ON_Interval Spectrum = ApproxSpectrumLTL(L);
		double lambda = Spectrum.Mid();
		double dist = Spectrum.Length() / 2.0;
		if (dist < tol && fabs(lambda)>dist )
		{
			double det = L.Determinant();
			rval = (det > 0) ? 1 : -1;
		}
	}
	return rval;
}